

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aloptional.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
al::optional<std::__cxx11::string>::value_or<char_const(&)[9]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,void *this,char (*defval) [9])

{
  size_type *psVar1;
  undefined8 uVar2;
  size_t sVar3;
  
  if (*this == '\x01') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = (size_type *)((long)this + 0x18);
    if (*(size_type **)((long)this + 8) == psVar1) {
      uVar2 = *(undefined8 *)((long)this + 0x20);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*(size_type **)((long)this + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = *(size_type *)((long)this + 0x10);
    *(size_type **)((long)this + 8) = psVar1;
    *(undefined8 *)((long)this + 0x10) = 0;
    *(undefined1 *)((long)this + 0x18) = 0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(*defval);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,defval,*defval + sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

T value_or(U&& defval) &&
    { return bool{*this} ? std::move(**this) : static_cast<T>(std::forward<U>(defval)); }